

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall
HighsSymmetryDetection::switchToNextNode(HighsSymmetryDetection *this,HighsInt backtrackDepth)

{
  uint cellCreationStackPos;
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer pNVar6;
  ulong uVar7;
  
  piVar1 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::resize
            (&this->nodeStack,(long)backtrackDepth);
  if (backtrackDepth != 0) {
    uVar7 = (ulong)((long)piVar2 - (long)piVar1) >> 2;
    pNVar6 = (this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      backtrack(this,pNVar6[-1].stackStart,(HighsInt)uVar7);
      cellCreationStackPos = pNVar6[-1].stackStart;
      uVar7 = (ulong)cellCreationStackPos;
      iVar4 = (int)((ulong)((long)(this->nodeStack).
                                  super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->nodeStack).
                                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
      iVar5 = this->firstPathDepth;
      if (iVar4 <= this->firstPathDepth) {
        iVar5 = iVar4;
      }
      this->firstPathDepth = iVar5;
      if (this->bestPathDepth < iVar4) {
        iVar4 = this->bestPathDepth;
      }
      this->bestPathDepth = iVar4;
      iVar5 = pNVar6[-1].certificateEnd;
      if (this->firstLeavePrefixLen < pNVar6[-1].certificateEnd) {
        iVar5 = this->firstLeavePrefixLen;
      }
      this->firstLeavePrefixLen = iVar5;
      iVar5 = pNVar6[-1].certificateEnd;
      iVar4 = this->bestLeavePrefixLen;
      if (iVar5 <= this->bestLeavePrefixLen) {
        iVar4 = iVar5;
      }
      this->bestLeavePrefixLen = iVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->currNodeCertificate,(long)iVar5);
      bVar3 = determineNextToDistinguish(this);
      if (bVar3) {
        cleanupBacktrack(this,cellCreationStackPos);
        bVar3 = distinguishVertex(this,pNVar6[-1].targetCell);
        if (!bVar3) goto LAB_002f736a;
        bVar3 = partitionRefinement(this);
        if (bVar3) {
          createNode(this);
          return;
        }
        pNVar6 = (this->nodeStack).
                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar7 = (ulong)((long)(this->cellCreationStack).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2;
      }
      else {
LAB_002f736a:
        pNVar6 = (this->nodeStack).
                 super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        (this->nodeStack).
        super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
        ._M_impl.super__Vector_impl_data._M_finish = pNVar6;
      }
    } while ((this->nodeStack).
             super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
             ._M_impl.super__Vector_impl_data._M_start != pNVar6);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::switchToNextNode(HighsInt backtrackDepth) {
  HighsInt stackEnd = cellCreationStack.size();
  // we need to backtrack the datastructures
  nodeStack.resize(backtrackDepth);
  if (backtrackDepth == 0) return;
  do {
    Node& currNode = nodeStack.back();
    backtrack(currNode.stackStart, stackEnd);
    stackEnd = currNode.stackStart;
    firstPathDepth = std::min((HighsInt)nodeStack.size(), firstPathDepth);
    bestPathDepth = std::min((HighsInt)nodeStack.size(), bestPathDepth);
    firstLeavePrefixLen =
        std::min(currNode.certificateEnd, firstLeavePrefixLen);
    bestLeavePrefixLen = std::min(currNode.certificateEnd, bestLeavePrefixLen);
    currNodeCertificate.resize(currNode.certificateEnd);
    if (!determineNextToDistinguish()) {
      nodeStack.pop_back();
      continue;
    }

    // call cleanup backtrack with the final stackEnd
    // so that all hashes are up to date and the link arrays do not contain
    // chains anymore
    cleanupBacktrack(stackEnd);
    HighsInt targetCell = currNode.targetCell;

    if (!distinguishVertex(targetCell)) {
      // if distinguishing the next vertex fails, it means that its certificate
      // value is lexicographically larger than that of the best leave
      nodeStack.pop_back();
      continue;
    }

    if (!partitionRefinement()) {
      stackEnd = cellCreationStack.size();
      continue;
    }

    createNode();
    break;
  } while (!nodeStack.empty());
}